

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O0

connection_context_t * create_connection_context(uv_os_sock_t sock,int is_server_connection)

{
  int iVar1;
  connection_context_t *handle;
  uv_loop_t *puVar2;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  connection_context_t *context;
  int r;
  int is_server_connection_local;
  uv_os_sock_t sock_local;
  
  handle = (connection_context_t *)malloc(0x130);
  if (handle == (connection_context_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
            ,0x97,"context","!=","NULL",0,"!=",0);
    abort();
  }
  handle->sock = sock;
  handle->is_server_connection = is_server_connection;
  handle->read = 0;
  handle->sent = 0;
  handle->open_handles = 0;
  handle->events = 0;
  handle->delayed_events = 0;
  handle->got_fin = 0;
  handle->sent_fin = 0;
  handle->got_disconnect = 0;
  puVar2 = uv_default_loop();
  iVar1 = uv_poll_init(puVar2,(uv_poll_t *)handle,sock);
  handle->open_handles = handle->open_handles + 1;
  (handle->poll_handle).data = handle;
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
            ,0xa7,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&handle->timer_handle);
  handle->open_handles = handle->open_handles + 1;
  (handle->timer_handle).data = handle;
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-poll.c"
            ,0xac,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  return handle;
}

Assistant:

static connection_context_t* create_connection_context(
    uv_os_sock_t sock, int is_server_connection) {
  int r;
  connection_context_t* context;

  context = (connection_context_t*) malloc(sizeof *context);
  ASSERT_NOT_NULL(context);

  context->sock = sock;
  context->is_server_connection = is_server_connection;
  context->read = 0;
  context->sent = 0;
  context->open_handles = 0;
  context->events = 0;
  context->delayed_events = 0;
  context->got_fin = 0;
  context->sent_fin = 0;
  context->got_disconnect = 0;

  r = uv_poll_init(uv_default_loop(), &context->poll_handle, sock);
  context->open_handles++;
  context->poll_handle.data = context;
  ASSERT_OK(r);

  r = uv_timer_init(uv_default_loop(), &context->timer_handle);
  context->open_handles++;
  context->timer_handle.data = context;
  ASSERT_OK(r);

  return context;
}